

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::scrape_failed_alert::scrape_failed_alert
          (scrape_failed_alert *this,stack_allocator *alloc,torrent_handle *h,endpoint *ep,
          string_view u,error_code *e)

{
  error_category *peVar1;
  bool bVar2;
  undefined3 uVar3;
  string local_68;
  scrape_failed_alert *local_48;
  char *pcStack_40;
  endpoint *local_38;
  endpoint *ep_local;
  torrent_handle *h_local;
  stack_allocator *alloc_local;
  scrape_failed_alert *this_local;
  string_view u_local;
  
  pcStack_40 = (char *)u.len_;
  local_48 = (scrape_failed_alert *)u.ptr_;
  local_38 = ep;
  ep_local = (endpoint *)h;
  h_local = (torrent_handle *)alloc;
  alloc_local = (stack_allocator *)this;
  this_local = local_48;
  u_local.ptr_ = pcStack_40;
  tracker_alert::tracker_alert(&this->super_tracker_alert,alloc,h,ep,u);
  (this->super_tracker_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__scrape_failed_alert_00990868;
  bVar2 = e->failed_;
  uVar3 = *(undefined3 *)&e->field_0x5;
  peVar1 = e->cat_;
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar2;
  *(undefined3 *)&(this->error).field_0x5 = uVar3;
  (this->error).cat_ = peVar1;
  libtorrent::aux::allocation_slot::allocation_slot(&this->m_msg_idx);
  boost::system::error_code::message_abi_cxx11_(&local_68,e);
  convert_from_native(&this->msg,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

scrape_failed_alert::scrape_failed_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, tcp::endpoint const& ep
		, string_view u, error_code const& e)
		: tracker_alert(alloc, h, ep, u)
		, error(e)
		, m_msg_idx()
#if TORRENT_ABI_VERSION == 1
		, msg(convert_from_native(e.message()))
#endif
	{
		TORRENT_ASSERT(!u.empty());
	}